

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

bool __thiscall dxil_spv::Converter::Impl::analyze_instructions(Impl *this,Function *func)

{
  BasicBlock *pBVar1;
  Instruction *pIVar2;
  undefined8 uVar3;
  bool bVar4;
  ValueKind VVar5;
  int iVar6;
  __normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
  _Var7;
  __normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
  _Var8;
  __normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>
  _Var9;
  IteratorAdaptor<LLVMBC::Instruction,___gnu_cxx::__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>_>
  IVar10;
  Instruction *pIVar11;
  Value *pVVar12;
  PHINode *inst;
  AtomicRMWInst *inst_00;
  AtomicCmpXchgInst *inst_01;
  AllocaInst *inst_02;
  GetElementPtrInst *inst_03;
  ExtractValueInst *inst_04;
  CmpInst *inst_05;
  CallInst *pCVar13;
  Function *pFVar14;
  String *pSVar15;
  Type *pTVar16;
  Instruction **ppIVar17;
  __node_base *p_Var18;
  iterator iVar19;
  Instruction *pIVar20;
  Vector<const_LLVMBC::Instruction_*> precise_instructions;
  Vector<LLVMBC::BasicBlock_*> visit_order;
  Instruction **local_88;
  iterator iStack_80;
  Instruction **local_78;
  undefined1 local_68 [56];
  
  if (((func != (Function *)0x0) && ((this->options).propagate_precise == true)) &&
     ((this->options).force_precise == false)) {
    local_88 = (Instruction **)0x0;
    iStack_80._M_current = (Instruction **)0x0;
    local_78 = (Instruction **)0x0;
    _Var7._M_current = (BasicBlock **)LLVMBC::Function::begin(func);
    _Var8._M_current = (BasicBlock **)LLVMBC::Function::end(func);
    if (_Var7._M_current == _Var8._M_current) {
      iVar19._M_current = (Instruction **)0x0;
      ppIVar17 = (Instruction **)0x0;
    }
    else {
      do {
        pBVar1 = *_Var7._M_current;
        _Var9._M_current = (Instruction **)LLVMBC::BasicBlock::begin(pBVar1);
        IVar10 = LLVMBC::BasicBlock::end(pBVar1);
        ppIVar17 = local_88;
        iVar19._M_current = iStack_80._M_current;
        for (; local_88 = ppIVar17, iStack_80._M_current = iVar19._M_current,
            (__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>
             )_Var9._M_current != IVar10.iter._M_current; _Var9._M_current = _Var9._M_current + 1) {
          pIVar20 = *_Var9._M_current;
          bVar4 = instruction_requires_no_contraction(pIVar20);
          if (bVar4) {
            local_68._0_8_ = pIVar20;
            if (iStack_80._M_current == local_78) {
              std::
              vector<LLVMBC::Instruction_const*,dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_const*>>
              ::_M_realloc_insert<LLVMBC::Instruction_const*>
                        ((vector<LLVMBC::Instruction_const*,dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_const*>>
                          *)&local_88,iStack_80,(Instruction **)local_68);
            }
            else {
              *iStack_80._M_current = pIVar20;
              iStack_80._M_current = iStack_80._M_current + 1;
            }
          }
          ppIVar17 = local_88;
          iVar19._M_current = iStack_80._M_current;
        }
        _Var7._M_current = _Var7._M_current + 1;
      } while (_Var7._M_current != _Var8._M_current);
    }
    local_68._0_8_ = local_68 + 0x30;
    local_68._8_8_ = (Instruction *)0x1;
    local_68._16_8_ = (_Hash_node_base *)0x0;
    local_68._24_8_ = 0;
    local_68._32_4_ = 1.0;
    local_68._40_8_ = 0;
    local_68._48_8_ = (__node_base_ptr)0x0;
    if (ppIVar17 != iVar19._M_current) {
      do {
        propagate_precise((UnorderedSet<const_LLVMBC::Instruction_*> *)local_68,*ppIVar17);
        ppIVar17 = ppIVar17 + 1;
      } while (ppIVar17 != iVar19._M_current);
    }
    std::
    _Hashtable<const_LLVMBC::Instruction_*,_const_LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::Instruction_*>,_std::hash<const_LLVMBC::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<const_LLVMBC::Instruction_*,_const_LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::Instruction_*>,_std::hash<const_LLVMBC::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_68);
    if (local_88 != (Instruction **)0x0) {
      free_in_thread(local_88);
    }
  }
  build_function_bb_visit_order_analysis((Vector<LLVMBC::BasicBlock_*> *)local_68,this,func);
  uVar3 = local_68._8_8_;
  pIVar20 = (Instruction *)local_68._0_8_;
  if (local_68._0_8_ != local_68._8_8_) {
    do {
      pBVar1 = (BasicBlock *)(pIVar20->super_Value).type;
      if ((this->options).eliminate_dead_code == true) {
        pIVar11 = LLVMBC::BasicBlock::getTerminator(pBVar1);
        mark_used_values(this,pIVar11);
      }
      _Var9._M_current = (Instruction **)LLVMBC::BasicBlock::begin(pBVar1);
      IVar10 = LLVMBC::BasicBlock::end(pBVar1);
      pIVar11 = (Instruction *)local_68._8_8_;
      for (; local_68._8_8_ = pIVar11,
          (__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>
           )_Var9._M_current != IVar10.iter._M_current; _Var9._M_current = _Var9._M_current + 1) {
        pIVar11 = *_Var9._M_current;
        if ((this->options).eliminate_dead_code == true) {
          mark_used_values(this,pIVar11);
        }
        if (pIVar11 == (Instruction *)0x0) goto LAB_001269cc;
        pVVar12 = LLVMBC::Internal::resolve_proxy(&pIVar11->super_Value);
        VVar5 = LLVMBC::Value::get_value_kind(pVVar12);
        if (VVar5 == Load) {
          bVar4 = analyze_load_instruction(this,(LoadInst *)pVVar12);
LAB_001269c4:
          if (bVar4 == false) goto LAB_00126b3a;
        }
        else {
          inst = (PHINode *)LLVMBC::Internal::resolve_proxy(&pIVar11->super_Value);
          VVar5 = LLVMBC::Value::get_value_kind((Value *)inst);
          if (VVar5 == PHI) {
            bVar4 = analyze_phi_instruction(this,inst);
            goto LAB_001269c4;
          }
          pVVar12 = LLVMBC::Internal::resolve_proxy(&pIVar11->super_Value);
          VVar5 = LLVMBC::Value::get_value_kind(pVVar12);
          if (VVar5 == Store) {
            bVar4 = analyze_store_instruction(this,(StoreInst *)pVVar12);
            goto LAB_001269c4;
          }
          inst_00 = (AtomicRMWInst *)LLVMBC::Internal::resolve_proxy(&pIVar11->super_Value);
          VVar5 = LLVMBC::Value::get_value_kind((Value *)inst_00);
          if (VVar5 == AtomicRMW) {
            bVar4 = analyze_atomicrmw_instruction(this,inst_00);
            goto LAB_001269c4;
          }
          inst_01 = (AtomicCmpXchgInst *)LLVMBC::Internal::resolve_proxy(&pIVar11->super_Value);
          VVar5 = LLVMBC::Value::get_value_kind((Value *)inst_01);
          if (VVar5 == AtomicCmpXchg) {
            bVar4 = analyze_cmpxchg_instruction(this,inst_01);
            goto LAB_001269c4;
          }
          inst_02 = (AllocaInst *)LLVMBC::Internal::resolve_proxy(&pIVar11->super_Value);
          VVar5 = LLVMBC::Value::get_value_kind((Value *)inst_02);
          if (VVar5 == Alloca) {
            bVar4 = analyze_alloca_instruction(this,inst_02);
            goto LAB_001269c4;
          }
          inst_03 = (GetElementPtrInst *)LLVMBC::Internal::resolve_proxy(&pIVar11->super_Value);
          VVar5 = LLVMBC::Value::get_value_kind((Value *)inst_03);
          if (VVar5 == GetElementPtr) {
            bVar4 = analyze_getelementptr_instruction(this,inst_03);
            goto LAB_001269c4;
          }
          inst_04 = (ExtractValueInst *)LLVMBC::Internal::resolve_proxy(&pIVar11->super_Value);
          VVar5 = LLVMBC::Value::get_value_kind((Value *)inst_04);
          if (VVar5 == ExtractValue) {
            bVar4 = analyze_extractvalue_instruction(this,inst_04);
            goto LAB_001269c4;
          }
          inst_05 = (CmpInst *)LLVMBC::Internal::resolve_proxy(&pIVar11->super_Value);
          VVar5 = LLVMBC::Value::get_value_kind((Value *)inst_05);
          bVar4 = LLVMBC::CmpInst::is_base_of_value_kind(VVar5);
          if (bVar4) {
            bVar4 = analyze_compare_instruction(this,inst_05);
            goto LAB_001269c4;
          }
          pCVar13 = (CallInst *)LLVMBC::Internal::resolve_proxy(&pIVar11->super_Value);
          VVar5 = LLVMBC::Value::get_value_kind((Value *)pCVar13);
          if (VVar5 == Call) {
            pFVar14 = LLVMBC::CallInst::getCalledFunction(pCVar13);
            pSVar15 = LLVMBC::Function::getName_abi_cxx11_(pFVar14);
            iVar6 = strncmp((pSVar15->_M_dataplus)._M_p,"dx.op",5);
            if (iVar6 == 0) {
              bVar4 = analyze_dxil_instruction(this,pCVar13,pBVar1);
              goto LAB_001269c4;
            }
          }
        }
LAB_001269cc:
        pIVar11 = (Instruction *)local_68._8_8_;
      }
      (this->ags).current_phase = 0;
      (this->ags).num_instructions = 0;
      (this->ags).active_read_backdoor = (Value *)0x0;
      pIVar20 = (Instruction *)&(pIVar20->super_Value).kind;
      pIVar2 = (Instruction *)local_68._0_8_;
    } while (pIVar20 != (Instruction *)uVar3);
    for (; pIVar2 != pIVar11; pIVar2 = (Instruction *)&(pIVar2->super_Value).kind) {
      pBVar1 = (BasicBlock *)(pIVar2->super_Value).type;
      _Var9._M_current = (Instruction **)LLVMBC::BasicBlock::begin(pBVar1);
      IVar10 = LLVMBC::BasicBlock::end(pBVar1);
      for (; (__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>
              )_Var9._M_current != IVar10.iter._M_current; _Var9._M_current = _Var9._M_current + 1)
      {
        if (*_Var9._M_current != (Instruction *)0x0) {
          pCVar13 = (CallInst *)LLVMBC::Internal::resolve_proxy(&(*_Var9._M_current)->super_Value);
          VVar5 = LLVMBC::Value::get_value_kind((Value *)pCVar13);
          if (VVar5 == Call) {
            pFVar14 = LLVMBC::CallInst::getCalledFunction(pCVar13);
            pSVar15 = LLVMBC::Function::getName_abi_cxx11_(pFVar14);
            iVar6 = strncmp((pSVar15->_M_dataplus)._M_p,"dx.op",5);
            if ((iVar6 == 0) &&
               (bVar4 = analyze_dxil_buffer_access_instruction(this,pCVar13), !bVar4))
            goto LAB_00126b3a;
          }
        }
      }
      (this->ags).current_phase = 0;
      (this->ags).num_instructions = 0;
      (this->ags).active_read_backdoor = (Value *)0x0;
    }
  }
  p_Var18 = &(this->alloca_tracking)._M_h._M_before_begin;
  do {
    p_Var18 = p_Var18->_M_nxt;
    if (p_Var18 == (__node_base *)0x0) {
      std::
      _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(&(this->ags).coopmat_component_mapping._M_h);
      bVar4 = true;
      goto LAB_00126b4f;
    }
    pTVar16 = LLVMBC::Value::getType((Value *)p_Var18[1]._M_nxt);
    pTVar16 = LLVMBC::Type::getPointerElementType(pTVar16);
    pTVar16 = LLVMBC::Type::getArrayElementType(pTVar16);
    bVar4 = analyze_alloca_cbv_forwarding_pre_resource_emit
                      (this,pTVar16,(AllocaCBVForwardingTracking *)(p_Var18 + 2));
  } while (bVar4);
LAB_00126b3a:
  bVar4 = false;
LAB_00126b4f:
  if ((Instruction *)local_68._0_8_ != (Instruction *)0x0) {
    free_in_thread((void *)local_68._0_8_);
  }
  return bVar4;
}

Assistant:

bool Converter::Impl::analyze_instructions(llvm::Function *func)
{
	// Need to analyze this in two stages.
	// In the first stage, we need to analyze:
	// - Load/GetElementPtr to handle lib global variables
	// - CreateHandle family to build LLVM access handles
	// - ExtractValue to track which components are used for BufferLoad.
	// In the second phase we analyze the buffer loads and stores and figure out
	// alignments of the loads and stores. This lets us build up a list of SSBO declarations we need to
	// optimally implement the loads and stores. We need to do this late, because we depend on results
	// of ExtractValue analysis.

	if (func && options.propagate_precise && !options.force_precise)
		propagate_precise(func);

	auto visit_order = build_function_bb_visit_order_analysis(func);

	for (auto *bb : visit_order)
	{
		if (options.eliminate_dead_code)
			mark_used_values(bb->getTerminator());

		for (auto &inst : *bb)
		{
			if (options.eliminate_dead_code)
				mark_used_values(&inst);

			if (auto *load_inst = llvm::dyn_cast<llvm::LoadInst>(&inst))
			{
				if (!analyze_load_instruction(*this, load_inst))
					return false;
			}
			else if (auto *phi_inst = llvm::dyn_cast<llvm::PHINode>(&inst))
			{
				if (!analyze_phi_instruction(*this, phi_inst))
					return false;
			}
			else if (auto *store_inst = llvm::dyn_cast<llvm::StoreInst>(&inst))
			{
				if (!analyze_store_instruction(*this, store_inst))
					return false;
			}
			else if (auto *atomicrmw_inst = llvm::dyn_cast<llvm::AtomicRMWInst>(&inst))
			{
				if (!analyze_atomicrmw_instruction(*this, atomicrmw_inst))
					return false;
			}
			else if (auto *cmpxchg_inst = llvm::dyn_cast<llvm::AtomicCmpXchgInst>(&inst))
			{
				if (!analyze_cmpxchg_instruction(*this, cmpxchg_inst))
					return false;
			}
			else if (auto *alloca_inst = llvm::dyn_cast<llvm::AllocaInst>(&inst))
			{
				if (!analyze_alloca_instruction(*this, alloca_inst))
					return false;
			}
			else if (auto *getelementptr_inst = llvm::dyn_cast<llvm::GetElementPtrInst>(&inst))
			{
				if (!analyze_getelementptr_instruction(*this, getelementptr_inst))
					return false;
			}
			else if (auto *extractvalue_inst = llvm::dyn_cast<llvm::ExtractValueInst>(&inst))
			{
				if (!analyze_extractvalue_instruction(*this, extractvalue_inst))
					return false;
			}
			else if (auto *cmp_inst = llvm::dyn_cast<llvm::CmpInst>(&inst))
			{
				if (!analyze_compare_instruction(*this, cmp_inst))
					return false;
			}
			else if (auto *call_inst = llvm::dyn_cast<llvm::CallInst>(&inst))
			{
				auto *called_function = call_inst->getCalledFunction();
				if (strncmp(called_function->getName().data(), "dx.op", 5) == 0)
				{
					if (!analyze_dxil_instruction(*this, call_inst, bb))
						return false;
				}
			}
		}

		// Reset AGS tracking for every BB.
		ags.reset();
	}

	for (auto *bb : visit_order)
	{
		for (auto &inst : *bb)
		{
			if (auto *call_inst = llvm::dyn_cast<llvm::CallInst>(&inst))
			{
				auto *called_function = call_inst->getCalledFunction();
				if (strncmp(called_function->getName().data(), "dx.op", 5) == 0)
				{
					if (!analyze_dxil_buffer_access_instruction(*this, call_inst))
						return false;
				}
			}
		}

		// Reset AGS tracking for every BB.
		ags.reset();
	}

	for (auto &alloc : alloca_tracking)
	{
		// Mark required resource aliases before we emit resources. Defer some work until after resource creation.
		const auto *scalar_type =
		    alloc.first->getType()->getPointerElementType()->getArrayElementType();
		if (!analyze_alloca_cbv_forwarding_pre_resource_emit(*this, scalar_type, alloc.second))
			return false;
	}

	ags.reset_analysis();

	return true;
}